

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp1.c
# Opt level: O0

void ssh1_bpp_handle_output(BinaryPacketProtocol *bpp)

{
  int iVar1;
  PktOut *pkt_00;
  int type;
  PktOut *pkt;
  ssh1_bpp_state *s;
  BinaryPacketProtocol *bpp_local;
  
  if (((ulong)bpp[-1].ic_out_pq.ctx & 1) == 0) {
    do {
      pkt_00 = (*(bpp->out_pq).after)(&(bpp->out_pq).pqb,(PacketQueueNode *)&bpp->out_pq,true);
      if (pkt_00 == (PktOut *)0x0) goto LAB_00125764;
      iVar1 = pkt_00->type;
      ssh1_bpp_format_packet((ssh1_bpp_state *)&bpp[-1].out_pq,pkt_00);
      ssh_free_pktout(pkt_00);
    } while (iVar1 != 0x25);
    *(undefined1 *)&bpp[-1].ic_out_pq.ctx = 1;
LAB_00125764:
    ssh_sendbuffer_changed(bpp->ssh);
  }
  return;
}

Assistant:

static void ssh1_bpp_handle_output(BinaryPacketProtocol *bpp)
{
    struct ssh1_bpp_state *s = container_of(bpp, struct ssh1_bpp_state, bpp);
    PktOut *pkt;

    if (s->pending_compression_request) {
        /*
         * Don't send any output packets while we're awaiting a
         * response to SSH1_CMSG_REQUEST_COMPRESSION, because if they
         * cross over in transit with the responding SSH1_CMSG_SUCCESS
         * then the other end could decode them with the wrong
         * compression settings.
         */
        return;
    }

    while ((pkt = pq_pop(&s->bpp.out_pq)) != NULL) {
        int type = pkt->type;
        ssh1_bpp_format_packet(s, pkt);
        ssh_free_pktout(pkt);

        if (type == SSH1_CMSG_REQUEST_COMPRESSION) {
            /*
             * When we see the actual compression request go past, set
             * the pending flag, and stop processing packets this
             * time.
             */
            s->pending_compression_request = true;
            break;
        }
    }

    ssh_sendbuffer_changed(bpp->ssh);
}